

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txdb.cpp
# Opt level: O2

unique_ptr<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>_> __thiscall
CCoinsViewDB::Cursor(CCoinsViewDB *this)

{
  bool bVar1;
  CCoinsViewDB *in_RSI;
  long in_FS_OFFSET;
  CoinEntry entry;
  CDBIterator *local_58;
  CDBIterator *local_50;
  uint256 local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = CDBWrapper::NewIterator
                       ((in_RSI->m_db)._M_t.
                        super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
                        super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                        super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl);
  GetBestBlock(&local_48,in_RSI);
  std::make_unique<CCoinsViewDBCursor,CDBIterator*,uint256>(&local_50,(uint256 *)&local_58);
  CDBIterator::Seek<unsigned_char>
            ((CDBIterator *)
             local_50[2].m_impl_iter._M_t.
             super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
             .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl,
             "C12CCoinsViewDB");
  bVar1 = CDBIterator::Valid((CDBIterator *)
                             local_50[2].m_impl_iter._M_t.
                             super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
                             .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl
                            );
  if (bVar1) {
    local_48.super_base_blob<256U>.m_data._M_elems._0_8_ = (long)&local_50[3].parent + 4;
    local_48.super_base_blob<256U>.m_data._M_elems[8] = 'C';
    CDBIterator::GetKey<(anonymous_namespace)::CoinEntry>
              ((CDBIterator *)
               local_50[2].m_impl_iter._M_t.
               super___uniq_ptr_impl<CDBIterator::IteratorImpl,_std::default_delete<CDBIterator::IteratorImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_CDBIterator::IteratorImpl_*,_std::default_delete<CDBIterator::IteratorImpl>_>
               .super__Head_base<0UL,_CDBIterator::IteratorImpl_*,_false>._M_head_impl,
               (CoinEntry *)&local_48);
    *(uchar *)&local_50[3].parent = local_48.super_base_blob<256U>.m_data._M_elems[8];
  }
  else {
    *(undefined1 *)&local_50[3].parent = 0;
  }
  (this->super_CCoinsView)._vptr_CCoinsView = (_func_int **)local_50;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>,_true,_true>)
           (__uniq_ptr_data<CCoinsViewCursor,_std::default_delete<CCoinsViewCursor>,_true,_true>)
           this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CCoinsViewCursor> CCoinsViewDB::Cursor() const
{
    auto i = std::make_unique<CCoinsViewDBCursor>(
        const_cast<CDBWrapper&>(*m_db).NewIterator(), GetBestBlock());
    /* It seems that there are no "const iterators" for LevelDB.  Since we
       only need read operations on it, use a const-cast to get around
       that restriction.  */
    i->pcursor->Seek(DB_COIN);
    // Cache key of first record
    if (i->pcursor->Valid()) {
        CoinEntry entry(&i->keyTmp.second);
        i->pcursor->GetKey(entry);
        i->keyTmp.first = entry.key;
    } else {
        i->keyTmp.first = 0; // Make sure Valid() and GetKey() return false
    }
    return i;
}